

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_nls.c
# Opt level: O0

int mriStep_NlsLSetup(int jbad,int *jcur,void *arkode_mem)

{
  int iVar1;
  undefined4 *in_RSI;
  int in_EDI;
  int retval;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffc8;
  undefined8 local_28;
  undefined8 local_20;
  undefined4 local_4;
  
  local_4 = mriStep_AccessARKODEStepMem
                      (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8
                       ,(ARKodeMRIStepMem *)0x1684fd);
  if (local_4 == 0) {
    if (in_EDI != 0) {
      *(undefined4 *)(local_28 + 0x11c) = 1;
    }
    *(long *)(local_28 + 0x180) = *(long *)(local_28 + 0x180) + 1;
    iVar1 = (**(code **)(local_28 + 0x138))
                      (*(undefined8 *)(local_20 + 0x2d0),local_20,*(undefined4 *)(local_28 + 0x11c),
                       *(undefined8 *)(local_20 + 0x228),
                       *(undefined8 *)
                        (*(long *)(local_28 + 0x30) +
                        (long)*(int *)(*(long *)(local_28 + 0x58) +
                                      (long)*(int *)(local_28 + 0x90) * 4) * 8),local_28 + 0x120,
                       *(undefined8 *)(local_20 + 0x248),*(undefined8 *)(local_20 + 0x250),
                       *(undefined8 *)(local_20 + 600));
    *in_RSI = *(undefined4 *)(local_28 + 0x120);
    *(undefined4 *)(local_20 + 0x394) = 0;
    *(undefined8 *)(local_28 + 0xe8) = 0x3ff0000000000000;
    *(undefined8 *)(local_28 + 0xc0) = 0x3ff0000000000000;
    *(undefined8 *)(local_28 + 0xb8) = *(undefined8 *)(local_28 + 0xb0);
    *(undefined8 *)(local_28 + 0x110) = *(undefined8 *)(local_20 + 0x310);
    if (iVar1 < 0) {
      local_4 = -6;
    }
    else if (iVar1 < 1) {
      local_4 = 0;
    }
    else {
      local_4 = 4;
    }
  }
  return local_4;
}

Assistant:

int mriStep_NlsLSetup(sunbooleantype jbad, sunbooleantype* jcur, void* arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMem and ARKodeMRIStepMem structures */
  retval = mriStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* update convfail based on jbad flag */
  if (jbad) { step_mem->convfail = ARK_FAIL_BAD_J; }

  /* Use ARKODE's tempv1, tempv2 and tempv3 as
     temporary vectors for the linear solver setup routine */
  step_mem->nsetups++;
  retval = step_mem->lsetup(ark_mem, step_mem->convfail, ark_mem->tcur,
                            ark_mem->ycur,
                            step_mem->Fsi[step_mem->stage_map[step_mem->istage]],
                            &(step_mem->jcur), ark_mem->tempv1, ark_mem->tempv2,
                            ark_mem->tempv3);

  /* update Jacobian status */
  *jcur = step_mem->jcur;

  /* update flags and 'gamma' values for last lsetup call */
  ark_mem->firststage = SUNFALSE;
  step_mem->gamrat = step_mem->crate = ONE;
  step_mem->gammap                   = step_mem->gamma;
  step_mem->nstlp                    = ark_mem->nst;

  if (retval < 0) { return (ARK_LSETUP_FAIL); }
  if (retval > 0) { return (CONV_FAIL); }

  return (ARK_SUCCESS);
}